

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMixedMeshControl::BuildMultiPhysicsMesh(TPZMHMixedMeshControl *this)

{
  TPZCompMesh *pTVar1;
  _Base_ptr p_Var2;
  TPZCompEl *pTVar3;
  TPZGeoEl *pTVar4;
  iterator iVar5;
  int64_t el_3;
  long lVar6;
  int64_t el;
  long lVar7;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  TPZStack<long,_10> gelindexes;
  TPZManVector<long,_10> shouldcreate;
  TPZManVector<TPZCompMesh_*,_10> meshvec;
  TPZMultiphysicsCompMesh *local_1c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1b8;
  TPZManVector<long,_10> local_188;
  TPZManVector<long,_10> local_110;
  TPZManVector<TPZCompMesh_*,_10> local_a0;
  
  pTVar1 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  if ((pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements != 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
               ,0x546);
  }
  TPZCreateApproximationSpace::SetAllCreateFunctionsMultiphysicElem(&pTVar1->fCreate);
  pTVar1 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  if (pTVar1 == (TPZCompMesh *)0x0) {
    local_1c0 = (TPZMultiphysicsCompMesh *)0x0;
  }
  else {
    local_1c0 = (TPZMultiphysicsCompMesh *)
                __dynamic_cast(pTVar1,&TPZCompMesh::typeinfo,&TPZMultiphysicsCompMesh::typeinfo,0);
  }
  TPZManVector<TPZCompMesh_*,_10>::TPZManVector
            (&local_a0,(ulong)((this->super_TPZMHMeshControl).fNState < 2) ^ 3);
  *local_a0.super_TPZVec<TPZCompMesh_*>.fStore = ((this->fFluxMesh).fRef)->fPointer;
  local_a0.super_TPZVec<TPZCompMesh_*>.fStore[1] =
       ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
  if (1 < (this->super_TPZMHMeshControl).fNState) {
    local_a0.super_TPZVec<TPZCompMesh_*>.fStore[2] = ((this->fRotationMesh).fRef)->fPointer;
  }
  local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<long,_10>::TPZManVector
            (&local_110,
             (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
             super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements,(long *)&local_188);
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b8._M_impl.super__Rb_tree_header._M_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar1 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var2 = (pTVar1->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pTVar1->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    local_188.super_TPZVec<long>._vptr_TPZVec = *(_func_int ***)(p_Var2 + 1);
    local_188.super_TPZVec<long>.fStore = (long *)p_Var2[1]._M_parent;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &local_1b8,(int *)&local_188);
  }
  lVar6 = (((this->fFluxMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  lVar7 = 0;
  if (lVar6 < 1) {
    lVar6 = lVar7;
  }
  while( true ) {
    if (lVar6 == lVar7) {
      lVar6 = (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fElementVec).
              super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      lVar7 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar7;
      }
      while( true ) {
        if (lVar6 == lVar7) {
          lVar6 = (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                  super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
          lVar7 = 0;
          if (lVar6 < 1) {
            lVar6 = lVar7;
          }
          for (; lVar7 != lVar6; lVar7 = lVar7 + 1) {
            pTVar4 = TPZGeoMesh::Element(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer,
                                         lVar7);
            if (local_110.super_TPZVec<long>.fStore[lVar7] != 0) {
              for (pTVar4 = TPZGeoEl::Father(pTVar4); pTVar4 != (TPZGeoEl *)0x0;
                  pTVar4 = TPZGeoEl::Father(pTVar4)) {
                if (local_110.super_TPZVec<long>.fStore[pTVar4->fIndex] == 1) {
                  local_110.super_TPZVec<long>.fStore[pTVar4->fIndex] = 0;
                }
              }
            }
          }
          TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_188);
          for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
            if (local_110.super_TPZVec<long>.fStore[lVar7] != 0) {
              TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_188,lVar7);
            }
          }
          TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
                    (local_1c0,&local_a0.super_TPZVec<TPZCompMesh_*>,&local_188.super_TPZVec<long>);
          TPZManVector<long,_10>::~TPZManVector(&local_188);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_1b8);
          TPZManVector<long,_10>::~TPZManVector(&local_110);
          TPZManVector<TPZCompMesh_*,_10>::~TPZManVector(&local_a0);
          return;
        }
        pTVar3 = TPZCompMesh::Element
                           (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer,lVar7)
        ;
        pTVar4 = TPZCompEl::Reference(pTVar3);
        local_188.super_TPZVec<long>._vptr_TPZVec =
             (_func_int **)CONCAT44(local_188.super_TPZVec<long>._vptr_TPZVec._4_4_,pTVar4->fMatId);
        iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                find(&local_1b8,(key_type *)&local_188);
        if ((_Rb_tree_header *)iVar5._M_node == &local_1b8._M_impl.super__Rb_tree_header) break;
        pTVar4 = TPZCompEl::Reference(pTVar3);
        local_110.super_TPZVec<long>.fStore[pTVar4->fIndex] = 1;
        lVar7 = lVar7 + 1;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                 ,0x569);
    }
    pTVar3 = TPZCompMesh::Element(((this->fFluxMesh).fRef)->fPointer,lVar7);
    pTVar4 = TPZCompEl::Reference(pTVar3);
    local_188.super_TPZVec<long>._vptr_TPZVec =
         (_func_int **)CONCAT44(local_188.super_TPZVec<long>._vptr_TPZVec._4_4_,pTVar4->fMatId);
    iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_1b8,(key_type *)&local_188);
    if ((_Rb_tree_header *)iVar5._M_node == &local_1b8._M_impl.super__Rb_tree_header) break;
    pTVar4 = TPZCompEl::Reference(pTVar3);
    local_110.super_TPZVec<long>.fStore[pTVar4->fIndex] = 1;
    lVar7 = lVar7 + 1;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
             ,0x55e);
}

Assistant:

void TPZMHMixedMeshControl::BuildMultiPhysicsMesh()
{
    if (fCMesh->NElements() != 0) {
        DebugStop();
    }
    fCMesh->SetAllCreateFunctionsMultiphysicElem();
    TPZMultiphysicsCompMesh *mphysics = dynamic_cast<TPZMultiphysicsCompMesh *>(fCMesh.operator->());
    int vecsize = 2;
    if(fNState > 1) vecsize = 3;
    TPZManVector<TPZCompMesh *> meshvec(vecsize);
    meshvec[0] = fFluxMesh.operator->();
    meshvec[1] = fPressureFineMesh.operator->();
    if(fNState > 1)
    {
        meshvec[2] = this->fRotationMesh.operator->();
    }
    TPZManVector<int64_t> shouldcreate(fGMesh->NElements(),0);
    std::set<int> matids;
    for (auto it : fCMesh->MaterialVec()) {
        matids.insert(it.first);
    }
    int64_t nel = fFluxMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = fFluxMesh->Element(el);
        TPZGeoEl *gel = cel->Reference();
        // this means that all geometric elements associated with flux elements will generate a computational element
        if (matids.find(gel->MaterialId()) == matids.end()) {
            DebugStop();
        }
        if (cel) {
            shouldcreate[cel->Reference()->Index()] = 1;
        }
    }
    nel = fPressureFineMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        TPZGeoEl *gel = cel->Reference();
        if (matids.find(gel->MaterialId()) == matids.end()) {
            DebugStop();
        }
        if (cel) {
            shouldcreate[cel->Reference()->Index()] = 1;
        }
    }
    // define the intersection of the finest references
    nel = fGMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (shouldcreate[el])
        {
            TPZGeoEl *fat = gel->Father();
            while(fat)
            {
                if(shouldcreate[fat->Index()] == 1)
                {
                    shouldcreate[fat->Index()] = 0;
                }
                fat = fat->Father();
            }
        }
    }
    TPZStack<int64_t> gelindexes;
    for (int64_t el=0; el<nel; el++) {
        if (shouldcreate[el])
        {
            gelindexes.Push(el);
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "Geometric indices for which we will create multiphysics elements" << std::endl;
        sout << gelindexes;
//        std::cout << sout.str() << std::endl;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    mphysics->BuildMultiphysicsSpace(meshvec,gelindexes);

}